

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_CompressedParseWhole_Test::
~BioparserSamTest_CompressedParseWhole_Test(BioparserSamTest_CompressedParseWhole_Test *this)

{
  BioparserSamTest::~BioparserSamTest(&this->super_BioparserSamTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, CompressedParseWhole) {
  Setup("sample.sam.gz");
  o = p->Parse(-1);
  Check();
}